

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O0

void anon_unknown.dwarf_178f1b::releasePixels
               (int type,Array2D<unsigned_int_*> *uintData,Array2D<float_*> *floatData,
               Array2D<Imath_3_2::half_*> *halfData,int width,int height)

{
  undefined8 in_RCX;
  Array2D<Imath_3_2::half_*> *in_RDX;
  Array2D<float_*> *in_RSI;
  undefined4 in_EDI;
  int unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  
  releasePixels(unaff_retaddr,(Array2D<unsigned_int_*> *)CONCAT44(in_EDI,in_stack_fffffffffffffff8),
                in_RSI,in_RDX,(int)((ulong)in_RCX >> 0x20),(int)in_RCX,height,(int)halfData);
  return;
}

Assistant:

void
releasePixels (
    int                     type,
    Array2D<unsigned int*>& uintData,
    Array2D<float*>&        floatData,
    Array2D<half*>&         halfData,
    int                     width,
    int                     height)
{
    releasePixels (
        type, uintData, floatData, halfData, 0, width - 1, 0, height - 1);
}